

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

PrepareResult __thiscall Statement::prepareInsert(Statement *this,string *str)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  uint32_t uVar3;
  int iVar4;
  istream *piVar5;
  size_type sVar6;
  reference pvVar7;
  ulong uVar8;
  char *pcVar9;
  string local_298 [8];
  string cpp;
  string local_270 [8];
  string email;
  string username;
  string id;
  string keyword;
  undefined1 local_1e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string token;
  stringstream ss;
  string *str_local;
  Statement *this_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(token.field_2._M_local_buf + 8),(string *)str,_Var2);
  std::__cxx11::string::string
            ((string *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e0,4);
  std::__cxx11::string::string((string *)(id.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(username.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_270);
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(token.field_2._M_local_buf + 8),
                        (string *)
                        &tokens.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,' ');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1e0,
                (value_type *)
                &tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1e0);
  if (sVar6 == 4) {
    std::__cxx11::string::string(local_298);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1e0,1);
    uVar3 = std::__cxx11::stoi(pvVar7,(size_t *)0x0,10);
    (this->rowToInsert).id = uVar3;
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_1e0,1);
    iVar4 = std::__cxx11::stoi(pvVar7,(size_t *)0x0,10);
    if (iVar4 < 0) {
      this_local._4_4_ = PrepareNegativeId;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1e0,2);
      uVar8 = std::__cxx11::string::length();
      if (uVar8 < 0x20) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1e0,2);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        strcpy((this->rowToInsert).username,pcVar9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1e0,3);
        uVar8 = std::__cxx11::string::length();
        if (uVar8 < 0x40) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1e0,3);
          pcVar9 = (char *)std::__cxx11::string::c_str();
          strcpy((this->rowToInsert).email,pcVar9);
          this_local._4_4_ = PrepareSuccess;
        }
        else {
          this_local._4_4_ = PrepareStringTooLong;
        }
      }
      else {
        this_local._4_4_ = PrepareStringTooLong;
      }
    }
    cpp.field_2._12_4_ = 1;
    std::__cxx11::string::~string(local_298);
  }
  else {
    this_local._4_4_ = PrepareSyntaxError;
    cpp.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string((string *)(email.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(username.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e0);
  std::__cxx11::string::~string
            ((string *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::stringstream::~stringstream((stringstream *)(token.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

PrepareResult Statement::prepareInsert(std::string str) {
	std::stringstream ss(str);
	std::string token;
	std::vector<std::string> tokens;
	tokens.reserve(4);
	std::string keyword, id, username, email;
	while (getline(ss, token, ' ')) {
		tokens.push_back(token);
	}
	if (tokens.size() != 4)
		return PrepareSyntaxError;

       std::string cpp;
	try {
		rowToInsert.id = stoi(tokens[1]);
	} catch(...) {
		return PrepareSyntaxError;
	}

	if (stoi(tokens[1]) < 0) {
		return PrepareNegativeId;
	}

	if (tokens[2].length() < 32) {
		strcpy(rowToInsert.username, tokens[2].c_str());
	} else {
		return PrepareStringTooLong;
	}

	if (tokens[3].length() < 64) {
		strcpy(rowToInsert.email, tokens[3].c_str());
	} else {
		return PrepareStringTooLong;
	}

	return PrepareSuccess;
}